

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_document_scanf(fy_document *fyd,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_38 [4];
  int ret;
  va_list ap;
  char *fmt_local;
  fy_document *fyd_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  ret = 0x30;
  local_38 = (undefined1  [4])0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  iVar1 = fy_document_vscanf(fyd,fmt,(__va_list_tag *)local_38);
  return iVar1;
}

Assistant:

int fy_document_scanf(struct fy_document *fyd, const char *fmt, ...) {
    va_list ap;
    int ret;

    va_start(ap, fmt);
    ret = fy_document_vscanf(fyd, fmt, ap);
    va_end(ap);

    return ret;
}